

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

Matrix * rw::Matrix::invertGeneral(Matrix *dst,Matrix *src)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar2 = (float)(src->at).z;
  fVar3 = (float)(src->up).y;
  fVar4 = (float)(src->up).z;
  fVar12 = (float)(src->at).y;
  fVar11 = fVar3 * fVar2 - fVar12 * fVar4;
  (dst->right).x = (float32)fVar11;
  fVar5 = (float)(src->right).z;
  fVar10 = fVar12 * fVar5 - (float)(src->right).y * fVar2;
  (dst->right).y = (float32)fVar10;
  fVar9 = (float)(src->right).y * fVar4 - fVar3 * fVar5;
  (dst->right).z = (float32)fVar9;
  fVar3 = (float)(src->up).x;
  fVar5 = (float)(src->at).x;
  fVar13 = (float)(src->right).x * fVar11 + fVar3 * fVar10 + fVar9 * fVar5;
  uVar7 = -(uint)(fVar13 != 0.0);
  fVar6 = (float)(~uVar7 & 0x3f800000 | (uint)(1.0 / fVar13) & uVar7);
  (dst->right).x = (float32)(fVar11 * fVar6);
  (dst->right).y = (float32)(fVar10 * fVar6);
  (dst->right).z = (float32)(fVar9 * fVar6);
  fVar15 = (fVar4 * fVar5 - fVar3 * fVar2) * fVar6;
  (dst->up).x = (float32)fVar15;
  fVar3 = (float)(src->right).x;
  fVar13 = (float)(src->right).z;
  fVar8 = (fVar2 * fVar3 - fVar13 * fVar5) * fVar6;
  (dst->up).y = (float32)fVar8;
  fVar2 = (float)(src->up).x;
  fVar14 = (fVar13 * fVar2 - fVar4 * fVar3) * fVar6;
  (dst->up).z = (float32)fVar14;
  fVar4 = (float)(src->up).y;
  fVar16 = (fVar2 * fVar12 - fVar5 * fVar4) * fVar6;
  (dst->at).x = (float32)fVar16;
  fVar5 = (float)(src->right).y;
  fVar13 = (fVar5 * (float)(src->at).x - fVar12 * fVar3) * fVar6;
  (dst->at).y = (float32)fVar13;
  fVar12 = (fVar3 * fVar4 - fVar2 * fVar5) * fVar6;
  (dst->at).z = (float32)fVar12;
  fVar2 = (float)(src->pos).y;
  fVar3 = (float)(src->pos).z;
  (dst->pos).x = (float32)-(fVar16 * fVar3 + fVar11 * fVar6 * (float)(src->pos).x + fVar15 * fVar2);
  fVar4 = (float)(src->pos).x;
  (dst->pos).y = (float32)-(fVar13 * fVar3 + fVar10 * fVar6 * fVar4 + fVar8 * fVar2);
  (dst->pos).z = (float32)-(fVar12 * fVar3 + fVar9 * fVar6 * fVar4 + fVar14 * (float)(src->pos).y);
  pbVar1 = (byte *)((long)&dst->flags + 2);
  *pbVar1 = *pbVar1 & 0xfd;
  return dst;
}

Assistant:

Matrix*
Matrix::invertGeneral(Matrix *dst, const Matrix *src)
{
	float32 det, invdet;
	// calculate a few cofactors
	dst->right.x = src->up.y*src->at.z - src->up.z*src->at.y;
	dst->right.y = src->at.y*src->right.z - src->at.z*src->right.y;
	dst->right.z = src->right.y*src->up.z - src->right.z*src->up.y;
	// get the determinant from that
	det = src->up.x * dst->right.y + src->at.x * dst->right.z + dst->right.x * src->right.x;
	invdet = 1.0;
	if(det != 0.0f)
		invdet = 1.0f/det;
	dst->right.x *= invdet;
	dst->right.y *= invdet;
	dst->right.z *= invdet;
	dst->up.x = invdet * (src->up.z*src->at.x - src->up.x*src->at.z);
	dst->up.y = invdet * (src->at.z*src->right.x - src->at.x*src->right.z);
	dst->up.z = invdet * (src->right.z*src->up.x - src->right.x*src->up.z);
	dst->at.x = invdet * (src->up.x*src->at.y - src->up.y*src->at.x);
	dst->at.y = invdet * (src->at.x*src->right.y - src->at.y*src->right.x);
	dst->at.z = invdet * (src->right.x*src->up.y - src->right.y*src->up.x);
	dst->pos.x = -(src->pos.x*dst->right.x + src->pos.y*dst->up.x + src->pos.z*dst->at.x);
	dst->pos.y = -(src->pos.x*dst->right.y + src->pos.y*dst->up.y + src->pos.z*dst->at.y);
	dst->pos.z = -(src->pos.x*dst->right.z + src->pos.y*dst->up.z + src->pos.z*dst->at.z);
	dst->flags &= ~IDENTITY;
	return dst;
}